

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::CoverpointSyntax::setChild(CoverpointSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar1;
  SyntaxNode *pSVar2;
  SyntaxList<slang::syntax::MemberSyntax> *pSVar3;
  logic_error *this_00;
  Token TVar4;
  CoverageIffClauseSyntax *local_190;
  ExpressionSyntax *local_188;
  NamedLabelSyntax *local_180;
  DataTypeSyntax *local_178;
  string local_150;
  allocator<char> local_119;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined8 local_78;
  Info *local_70;
  undefined8 local_68;
  Info *local_60;
  undefined8 local_58;
  Info *local_50;
  ExpressionSyntax *local_48;
  ExpressionSyntax *local_40;
  undefined8 local_38;
  Info *local_30;
  DataTypeSyntax *local_28;
  DataTypeSyntax *local_20;
  size_t local_18;
  size_t index_local;
  CoverpointSyntax *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  switch(index) {
  case 0:
    pSVar2 = TokenOrSyntax::node(&child);
    pSVar1 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>
                       (pSVar2);
    SyntaxList<slang::syntax::AttributeInstanceSyntax>::operator=
              (&(this->super_MemberSyntax).attributes,pSVar1);
    break;
  case 1:
    pSVar2 = TokenOrSyntax::node(&child);
    if (pSVar2 == (SyntaxNode *)0x0) {
      local_178 = (DataTypeSyntax *)0x0;
    }
    else {
      pSVar2 = TokenOrSyntax::node(&child);
      local_178 = SyntaxNode::as<slang::syntax::DataTypeSyntax>(pSVar2);
    }
    local_28 = local_178;
    not_null<slang::syntax::DataTypeSyntax*>::not_null<slang::syntax::DataTypeSyntax*,void>
              ((not_null<slang::syntax::DataTypeSyntax*> *)&local_20,&local_28);
    (this->type).ptr = local_20;
    break;
  case 2:
    pSVar2 = TokenOrSyntax::node(&child);
    if (pSVar2 == (SyntaxNode *)0x0) {
      local_180 = (NamedLabelSyntax *)0x0;
    }
    else {
      pSVar2 = TokenOrSyntax::node(&child);
      local_180 = SyntaxNode::as<slang::syntax::NamedLabelSyntax>(pSVar2);
    }
    this->label = local_180;
    break;
  case 3:
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_38 = TVar4._0_8_;
    (this->coverpoint).kind = (undefined2)local_38;
    (this->coverpoint).field_0x2 = local_38._2_1_;
    (this->coverpoint).numFlags = (NumericTokenFlags)local_38._3_1_;
    (this->coverpoint).rawLen = local_38._4_4_;
    local_30 = TVar4.info;
    (this->coverpoint).info = local_30;
    break;
  case 4:
    pSVar2 = TokenOrSyntax::node(&child);
    if (pSVar2 == (SyntaxNode *)0x0) {
      local_188 = (ExpressionSyntax *)0x0;
    }
    else {
      pSVar2 = TokenOrSyntax::node(&child);
      local_188 = SyntaxNode::as<slang::syntax::ExpressionSyntax>(pSVar2);
    }
    local_48 = local_188;
    not_null<slang::syntax::ExpressionSyntax*>::not_null<slang::syntax::ExpressionSyntax*,void>
              ((not_null<slang::syntax::ExpressionSyntax*> *)&local_40,&local_48);
    (this->expr).ptr = local_40;
    break;
  case 5:
    pSVar2 = TokenOrSyntax::node(&child);
    if (pSVar2 == (SyntaxNode *)0x0) {
      local_190 = (CoverageIffClauseSyntax *)0x0;
    }
    else {
      pSVar2 = TokenOrSyntax::node(&child);
      local_190 = SyntaxNode::as<slang::syntax::CoverageIffClauseSyntax>(pSVar2);
    }
    this->iff = local_190;
    break;
  case 6:
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_58 = TVar4._0_8_;
    (this->openBrace).kind = (undefined2)local_58;
    (this->openBrace).field_0x2 = local_58._2_1_;
    (this->openBrace).numFlags = (NumericTokenFlags)local_58._3_1_;
    (this->openBrace).rawLen = local_58._4_4_;
    local_50 = TVar4.info;
    (this->openBrace).info = local_50;
    break;
  case 7:
    pSVar2 = TokenOrSyntax::node(&child);
    pSVar3 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::MemberSyntax>>(pSVar2);
    SyntaxList<slang::syntax::MemberSyntax>::operator=(&this->members,pSVar3);
    break;
  case 8:
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_68 = TVar4._0_8_;
    (this->closeBrace).kind = (undefined2)local_68;
    (this->closeBrace).field_0x2 = local_68._2_1_;
    (this->closeBrace).numFlags = (NumericTokenFlags)local_68._3_1_;
    (this->closeBrace).rawLen = local_68._4_4_;
    local_60 = TVar4.info;
    (this->closeBrace).info = local_60;
    break;
  case 9:
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_78 = TVar4._0_8_;
    (this->emptySemi).kind = (undefined2)local_78;
    (this->emptySemi).field_0x2 = local_78._2_1_;
    (this->emptySemi).numFlags = (NumericTokenFlags)local_78._3_1_;
    (this->emptySemi).rawLen = local_78._4_4_;
    local_70 = TVar4.info;
    (this->emptySemi).info = local_70;
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O0/extern/slang/source/AllSyntax.cpp"
               ,&local_119);
    std::operator+(&local_f8,&local_118,":");
    std::__cxx11::to_string(&local_150,0xdb4);
    std::operator+(&local_d8,&local_f8,&local_150);
    std::operator+(&local_b8,&local_d8,": ");
    std::operator+(&local_98,&local_b8,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_98);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

void CoverpointSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: type = child.node() ? &child.node()->as<DataTypeSyntax>() : nullptr; return;
        case 2: label = child.node() ? &child.node()->as<NamedLabelSyntax>() : nullptr; return;
        case 3: coverpoint = child.token(); return;
        case 4: expr = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 5: iff = child.node() ? &child.node()->as<CoverageIffClauseSyntax>() : nullptr; return;
        case 6: openBrace = child.token(); return;
        case 7: members = child.node()->as<SyntaxList<MemberSyntax>>(); return;
        case 8: closeBrace = child.token(); return;
        case 9: emptySemi = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}